

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber *
uprv_decNumberNextToward_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  int32_t iVar1;
  uint8_t local_61;
  uint32_t local_60;
  int32_t iStack_5c;
  uint8_t sub;
  uint32_t status;
  int32_t result;
  decContext workset;
  decNumber dtiny;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  status = set->digits;
  unique0x00012004 = set->emax;
  workset.digits = set->emin;
  workset.emax = set->round;
  workset.emin = set->traps;
  workset.round = set->status;
  workset.traps = *(uint32_t *)&set->clamp;
  local_60 = 0;
  if (((lhs->bits & 0x30) == 0) && ((rhs->bits & 0x30) == 0)) {
    iStack_5c = decCompare(lhs,rhs,'\0');
    if (iStack_5c == -0x80000000) {
      local_60 = local_60 | 0x10;
    }
    else if (iStack_5c == 0) {
      uprv_decNumberCopySign_63(res,lhs,rhs);
    }
    else {
      if (iStack_5c < 0) {
        if ((lhs->bits & 0xc0) == 0xc0) {
          decSetMaxValue(res,set);
          res->bits = 0x80;
          return res;
        }
        workset._0_8_ = workset._0_8_ & 0xffffffff;
        local_61 = '\0';
      }
      else {
        if ((lhs->bits & 0xc0) == 0x40) {
          decSetMaxValue(res,set);
          return res;
        }
        workset.emax = 6;
        local_61 = 0x80;
      }
      uprv_decNumberZero_63((decNumber *)&workset.status);
      workset.clamp = '\0';
      workset._25_3_ = 0xc46536;
      decAddOp(res,lhs,(decNumber *)&workset.status,(decContext *)&status,local_61,&local_60);
      iVar1 = uprv_decNumberIsNormal_63(res,set);
      if (iVar1 != 0) {
        local_60 = 0;
      }
    }
  }
  else {
    decNaNs(res,lhs,rhs,set,&local_60);
  }
  if (local_60 != 0) {
    decStatus(res,local_60,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberNextToward(decNumber *res, const decNumber *lhs,
                                const decNumber *rhs, decContext *set) {
  decNumber dtiny;                           /* constant  */
  decContext workset=*set;                   /* work  */
  Int result;                                /* ..  */
  uInt status=0;                             /* accumulator  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (decNumberIsNaN(lhs) || decNumberIsNaN(rhs)) {
    decNaNs(res, lhs, rhs, set, &status);
    }
   else { /* Is numeric, so no chance of sNaN Invalid, etc.  */
    result=decCompare(lhs, rhs, 0);     /* sign matters  */
    if (result==BADINT) status|=DEC_Insufficient_storage; /* rare  */
     else { /* valid compare  */
      if (result==0) uprv_decNumberCopySign(res, lhs, rhs); /* easy  */
       else { /* differ: need NextPlus or NextMinus  */
        uByte sub;                      /* add or subtract  */
        if (result<0) {                 /* lhs<rhs, do nextplus  */
          /* -Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==(DECINF|DECNEG)) {
            decSetMaxValue(res, set);
            res->bits=DECNEG;           /* negative  */
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_CEILING;
          sub=0;                        /* add, please  */
          } /* plus  */
         else {                         /* lhs>rhs, do nextminus  */
          /* +Infinity is the special case  */
          if ((lhs->bits&(DECINF|DECNEG))==DECINF) {
            decSetMaxValue(res, set);
            return res;                 /* there is no status to set  */
            }
          workset.round=DEC_ROUND_FLOOR;
          sub=DECNEG;                   /* subtract, please  */
          } /* minus  */
        uprv_decNumberZero(&dtiny);          /* start with 0  */
        dtiny.lsu[0]=1;                 /* make number that is ..  */
        dtiny.exponent=DEC_MIN_EMIN-1;  /* .. smaller than tiniest  */
        decAddOp(res, lhs, &dtiny, &workset, sub, &status); /* + or -  */
        /* turn off exceptions if the result is a normal number  */
        /* (including Nmin), otherwise let all status through  */
        if (uprv_decNumberIsNormal(res, set)) status=0;
        } /* unequal  */
      } /* compare OK  */
    } /* numeric  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }